

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_is_symlink(char *file,wchar_t line,char *path,char *contents)

{
  wchar_t wVar1;
  long in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  char *in_RDI;
  char *in_stack_000001a0;
  char *in_stack_000001a8;
  wchar_t in_stack_000001b4;
  char *in_stack_000001b8;
  wchar_t local_4;
  
  wVar1 = is_symlink(in_stack_000001b8,in_stack_000001b4,in_stack_000001a8,in_stack_000001a0);
  if (wVar1 == L'\0') {
    if (in_RCX == 0) {
      failure_start(in_RDI,(wchar_t)(ulong)in_ESI,"File %s is not a symlink",in_RDX);
    }
    else {
      failure_start(in_RDI,(wchar_t)(ulong)in_ESI,"File %s is not a symlink to %s",in_RDX,in_RCX);
    }
    failure_finish((void *)0x1067ca);
    local_4 = L'\0';
  }
  else {
    local_4 = L'\x01';
  }
  return local_4;
}

Assistant:

int
assertion_is_symlink(const char *file, int line,
    const char *path, const char *contents)
{
	if (is_symlink(file, line, path, contents))
		return (1);
	if (contents)
		failure_start(file, line, "File %s is not a symlink to %s",
		    path, contents);
	else
		failure_start(file, line, "File %s is not a symlink", path);
	failure_finish(NULL);
	return (0);
}